

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

int Lpk_CountSupp(Abc_Ntk_t *p,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  int local_30;
  int Count;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes_local;
  Abc_Ntk_t *p_local;
  
  local_34 = 0;
  for (Count = 0; iVar1 = Vec_PtrSize(vNodes), Count < iVar1; Count = Count + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,Count);
    for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1) {
      pAVar3 = Abc_ObjFanin(pAVar2,local_30);
      iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
      if (iVar1 == 0) {
        local_34 = (uint)(((*(uint *)&pAVar3->field_0x14 >> 9 & 1) != 0 ^ 0xffU) & 1) + local_34;
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfffffdff | 0x200;
      }
    }
  }
  for (Count = 0; iVar1 = Vec_PtrSize(vNodes), Count < iVar1; Count = Count + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,Count);
    for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1) {
      pAVar3 = Abc_ObjFanin(pAVar2,local_30);
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfffffdff;
    }
  }
  return local_34;
}

Assistant:

int Lpk_CountSupp( Abc_Ntk_t * p, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pObj, * pFanin; 
    int i, k, Count = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanin) )
                continue;
            Count += !pFanin->fPersist;
            pFanin->fPersist = 1;
        }
    }
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pFanin->fPersist = 0;
    return Count;
}